

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

void __thiscall Rml::Element::OnDpRatioChangeRecursive(Element *this)

{
  uint uVar1;
  ulong uVar2;
  
  ElementEffects::DirtyEffects(&this->meta->effects);
  ElementStyle::DirtyPropertiesWithUnits(&this->meta->style,DP_SCALABLE_LENGTH);
  (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0xe])(this);
  uVar1 = (uint)((ulong)((long)(this->children).
                               super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->children).
                              super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      OnDpRatioChangeRecursive
                ((Element *)
                 (this->children).
                 super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_t.
                 super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t);
      uVar2 = uVar2 + 1;
    } while ((uVar1 & 0x7fffffff) != uVar2);
  }
  return;
}

Assistant:

void Element::OnDpRatioChangeRecursive()
{
	meta->effects.DirtyEffects();
	GetStyle()->DirtyPropertiesWithUnits(Unit::DP_SCALABLE_LENGTH);

	OnDpRatioChange();

	// Now dirty all of our descendants.
	const int num_children = GetNumChildren(true);
	for (int i = 0; i < num_children; ++i)
		GetChild(i)->OnDpRatioChangeRecursive();
}